

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

uint32_t gcd(uint32_t u,uint32_t v)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint t;
  int shift;
  uint32_t v_local;
  uint32_t u_local;
  
  v_local = v;
  if ((u != 0) && (v_local = u, v != 0)) {
    bVar1 = 0;
    for (uVar3 = u | v; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x80000000) {
      bVar1 = bVar1 + 1;
    }
    bVar2 = 0;
    for (uVar3 = u; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x80000000) {
      bVar2 = bVar2 + 1;
    }
    shift = u >> (bVar2 & 0x1f);
    t = v;
    do {
      bVar2 = 0;
      for (uVar3 = t; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x80000000) {
        bVar2 = bVar2 + 1;
      }
      uVar3 = t >> (bVar2 & 0x1f);
      t = uVar3;
      if (uVar3 < (uint)shift) {
        t = shift;
        shift = uVar3;
      }
      t = t - shift;
    } while (t != 0);
    v_local = shift << (bVar1 & 0x1f);
  }
  return v_local;
}

Assistant:

uint32_t
gcd(uint32_t u, uint32_t v)
{
    int shift;
    if (u == 0) return v;
    if (v == 0) return u;
    shift = __builtin_ctz(u | v);
    u >>= __builtin_ctz(u);
    do {
        v >>= __builtin_ctz(v);
        if (u > v) {
            unsigned int t = v;
            v = u;
            u = t;
        }
        v = v - u;
    } while (v != 0);
    return u << shift;
}